

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

bool __thiscall Mat::operator==(Mat *this,Mat *p)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [12];
  undefined1 auVar7 [13];
  undefined1 auVar8 [14];
  undefined8 uVar9;
  reference pvVar10;
  ll128 *plVar11;
  int *in_RDI;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  int i;
  int l;
  char local_48;
  char cStackY_47;
  char cStackY_46;
  char cStackY_45;
  Mat *this_00;
  int local_20;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  local_20 = 0;
  while( true ) {
    if (iVar1 * iVar2 <= local_20) {
      return true;
    }
    pvVar10 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                        ((vector<__int128,_std::allocator<__int128>_> *)(in_RDI + 4),(long)local_20)
    ;
    uVar9 = (undefined8)*pvVar10;
    this_00 = *(Mat **)((long)pvVar10 + 8);
    plVar11 = getVal(this_00,(int)((ulong)uVar9 >> 0x20));
    local_48 = (char)uVar9;
    cStackY_47 = (char)((ulong)uVar9 >> 8);
    cStackY_46 = (char)((ulong)uVar9 >> 0x10);
    cStackY_45 = (char)((ulong)uVar9 >> 0x18);
    cVar12 = -(local_48 == (char)*plVar11);
    cVar13 = -(cStackY_47 == *(char *)((long)plVar11 + 1));
    cVar14 = -(cStackY_46 == *(char *)((long)plVar11 + 2));
    cVar15 = -(cStackY_45 == *(char *)((long)plVar11 + 3));
    cVar16 = -((char)((ulong)uVar9 >> 0x20) == *(char *)((long)plVar11 + 4));
    cVar17 = -((char)((ulong)uVar9 >> 0x28) == *(char *)((long)plVar11 + 5));
    cVar18 = -((char)((ulong)uVar9 >> 0x30) == *(char *)((long)plVar11 + 6));
    cVar19 = -((char)((ulong)uVar9 >> 0x38) == *(char *)((long)plVar11 + 7));
    cVar20 = -((char)this_00 == *(char *)((long)plVar11 + 8));
    cVar21 = -((char)((ulong)this_00 >> 8) == *(char *)((long)plVar11 + 9));
    cVar22 = -((char)((ulong)this_00 >> 0x10) == *(char *)((long)plVar11 + 10));
    cVar23 = -((char)((ulong)this_00 >> 0x18) == *(char *)((long)plVar11 + 0xb));
    cVar24 = -((char)((ulong)this_00 >> 0x20) == *(char *)((long)plVar11 + 0xc));
    cVar25 = -((char)((ulong)this_00 >> 0x28) == *(char *)((long)plVar11 + 0xd));
    cVar26 = -((char)((ulong)this_00 >> 0x30) == *(char *)((long)plVar11 + 0xe));
    bVar27 = -((char)((ulong)this_00 >> 0x38) == *(char *)((long)plVar11 + 0xf));
    auVar3[1] = cVar13;
    auVar3[0] = cVar12;
    auVar3[2] = cVar14;
    auVar3[3] = cVar15;
    auVar3[4] = cVar16;
    auVar3[5] = cVar17;
    auVar3[6] = cVar18;
    auVar3[7] = cVar19;
    auVar3[8] = cVar20;
    auVar3[9] = cVar21;
    auVar3[10] = cVar22;
    auVar3[0xb] = cVar23;
    auVar3[0xc] = cVar24;
    auVar3[0xd] = cVar25;
    auVar3[0xe] = cVar26;
    auVar3[0xf] = bVar27;
    auVar4[1] = cVar13;
    auVar4[0] = cVar12;
    auVar4[2] = cVar14;
    auVar4[3] = cVar15;
    auVar4[4] = cVar16;
    auVar4[5] = cVar17;
    auVar4[6] = cVar18;
    auVar4[7] = cVar19;
    auVar4[8] = cVar20;
    auVar4[9] = cVar21;
    auVar4[10] = cVar22;
    auVar4[0xb] = cVar23;
    auVar4[0xc] = cVar24;
    auVar4[0xd] = cVar25;
    auVar4[0xe] = cVar26;
    auVar4[0xf] = bVar27;
    auVar8[1] = cVar15;
    auVar8[0] = cVar14;
    auVar8[2] = cVar16;
    auVar8[3] = cVar17;
    auVar8[4] = cVar18;
    auVar8[5] = cVar19;
    auVar8[6] = cVar20;
    auVar8[7] = cVar21;
    auVar8[8] = cVar22;
    auVar8[9] = cVar23;
    auVar8[10] = cVar24;
    auVar8[0xb] = cVar25;
    auVar8[0xc] = cVar26;
    auVar8[0xd] = bVar27;
    auVar7[1] = cVar16;
    auVar7[0] = cVar15;
    auVar7[2] = cVar17;
    auVar7[3] = cVar18;
    auVar7[4] = cVar19;
    auVar7[5] = cVar20;
    auVar7[6] = cVar21;
    auVar7[7] = cVar22;
    auVar7[8] = cVar23;
    auVar7[9] = cVar24;
    auVar7[10] = cVar25;
    auVar7[0xb] = cVar26;
    auVar7[0xc] = bVar27;
    auVar6[1] = cVar17;
    auVar6[0] = cVar16;
    auVar6[2] = cVar18;
    auVar6[3] = cVar19;
    auVar6[4] = cVar20;
    auVar6[5] = cVar21;
    auVar6[6] = cVar22;
    auVar6[7] = cVar23;
    auVar6[8] = cVar24;
    auVar6[9] = cVar25;
    auVar6[10] = cVar26;
    auVar6[0xb] = bVar27;
    auVar5[1] = cVar18;
    auVar5[0] = cVar17;
    auVar5[2] = cVar19;
    auVar5[3] = cVar20;
    auVar5[4] = cVar21;
    auVar5[5] = cVar22;
    auVar5[6] = cVar23;
    auVar5[7] = cVar24;
    auVar5[8] = cVar25;
    auVar5[9] = cVar26;
    auVar5[10] = bVar27;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar8 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar7 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar6 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar27,CONCAT18(cVar26,CONCAT17(cVar25,CONCAT16(cVar24,
                                                  CONCAT15(cVar23,CONCAT14(cVar22,CONCAT13(cVar21,
                                                  CONCAT12(cVar20,CONCAT11(cVar19,cVar18))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar27,CONCAT17(cVar26,CONCAT16(cVar25,CONCAT15(cVar24,
                                                  CONCAT14(cVar23,CONCAT13(cVar22,CONCAT12(cVar21,
                                                  CONCAT11(cVar20,cVar19)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar27 >> 7) << 0xf) != 0xffff) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool Mat::operator==(Mat p) {
    int l = r * c;
//    bool match = true;
    for (int i = 0; i < l; i++) {
        if (val[i] != p.getVal(i)) {
            return false;
        }
    }
    return true;
}